

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O2

void __thiscall
IntrusiveList<VariableHandle>::push_back(IntrusiveList<VariableHandle> *this,VariableHandle *node)

{
  uint __line;
  VariableHandle **ppVVar1;
  char *__assertion;
  bool bVar2;
  
  if (node == (VariableHandle *)0x0) {
    __assertion = "node";
    __line = 0xf;
  }
  else if (node->next == (VariableHandle *)0x0) {
    if (node->listed != true) {
      node->listed = true;
      bVar2 = this->head != (VariableHandle *)0x0;
      ppVVar1 = &this->tail->next;
      if (!bVar2) {
        ppVVar1 = &this->tail;
      }
      *ppVVar1 = node;
      (&this->head)[bVar2] = node;
      return;
    }
    __assertion = "!node->listed";
    __line = 0x11;
  }
  else {
    __assertion = "node->next == 0";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,__line,"void IntrusiveList<VariableHandle>::push_back(T *) [T = VariableHandle]");
}

Assistant:

void push_back(T *node)
	{
		assert(node);
		assert(node->next == 0);
		assert(!node->listed);

		node->listed = true;

		if(!head)
		{
			head = tail = node;
		}
		else
		{
			tail->next = node;
			tail = node;
		}
	}